

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

logical pnga_destroy(Integer g_a)

{
  long lVar1;
  long grp_id_00;
  long in_RDI;
  cache_struct_t *next;
  int local_sync_end;
  int local_sync_begin;
  Integer grp_me;
  Integer grp_id;
  Integer ga_handle;
  ARMCI_Group *in_stack_ffffffffffffffc8;
  cache_struct *pcVar2;
  int iVar3;
  int iVar4;
  Integer local_28;
  logical local_8;
  
  iVar3 = _ga_sync_end;
  iVar4 = _ga_sync_begin;
  lVar1 = in_RDI + 1000;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  grp_id_00 = (long)GA[lVar1].p_handle;
  if (iVar4 != 0) {
    pnga_pgroup_sync(CONCAT44(iVar4,iVar3));
  }
  if (grp_id_00 < 1) {
    local_28 = GAme;
  }
  else {
    local_28 = (Integer)PGRP_LIST[grp_id_00].map_proc_list[GAme];
  }
  GAstat.numdes = GAstat.numdes + 1;
  if ((lVar1 < 0) || (_max_global_array <= lVar1)) {
    local_8 = 0;
  }
  else if (GA[lVar1].actv == 0) {
    local_8 = 0;
  }
  else {
    if (GA[lVar1].cache != (double *)0x0) {
      free(GA[lVar1].cache);
    }
    GA[lVar1].cache = (double *)0x0;
    GA[lVar1].actv = 0;
    GA[lVar1].actv_handle = 0;
    if (0 < GA[lVar1].num_rstrctd) {
      GA[lVar1].num_rstrctd = 0;
      if (GA[lVar1].rstrctd_list != (C_Integer *)0x0) {
        free(GA[lVar1].rstrctd_list);
      }
      GA[lVar1].rstrctd_list = (C_Integer *)0x0;
      if (GA[lVar1].rank_rstrctd != (C_Integer *)0x0) {
        free(GA[lVar1].rank_rstrctd);
      }
      GA[lVar1].rank_rstrctd = (C_Integer *)0x0;
    }
    if (GA[lVar1].mapc != (C_Integer *)0x0) {
      free(GA[lVar1].mapc);
      GA[lVar1].mapc = (C_Integer *)0x0;
    }
    if ((GA[lVar1].property == 2) && (GA[lVar1].cache_head != (cache_struct_t *)0x0)) {
      pcVar2 = (GA[lVar1].cache_head)->next;
      if ((GA[lVar1].cache_head)->cache_buf != (void *)0x0) {
        free((GA[lVar1].cache_head)->cache_buf);
      }
      free(GA[lVar1].cache_head);
      while (pcVar2 != (cache_struct *)0x0) {
        GA[lVar1].cache_head = pcVar2;
        pcVar2 = pcVar2->next;
        if ((GA[lVar1].cache_head)->cache_buf != (void *)0x0) {
          free((GA[lVar1].cache_head)->cache_buf);
        }
        free(GA[lVar1].cache_head);
      }
      in_stack_ffffffffffffffc8 = (ARMCI_Group *)0x0;
    }
    GA[lVar1].cache_head = (cache_struct_t *)0x0;
    if (GA[lVar1].property == 1) {
      free(GA[lVar1].old_mapc);
      pnga_pgroup_destroy(grp_id_00);
    }
    if (GA[lVar1].ptr[local_28] == (char *)0x0) {
      local_8 = 1;
    }
    else {
      if (GA[lVar1].overlay == 0) {
        if (grp_id_00 < 1) {
          if (GA[lVar1].mem_dev_set == 0) {
            ARMCI_Free((void *)0x1e506b);
          }
          else {
            ARMCI_Free_memdev((void *)0x1e501a);
          }
        }
        else {
          ARMCI_Free_group((void *)CONCAT44(iVar4,iVar3),in_stack_ffffffffffffffc8);
        }
        if (GA_memory_limited != 0) {
          GA_total_memory = GA[lVar1].size + GA_total_memory;
        }
        GAstat.curmem = GAstat.curmem - GA[lVar1].size;
      }
      else {
        GA[lVar1].overlay = 0;
      }
      GA[lVar1].mem_dev_set = 0;
      if (iVar3 != 0) {
        pnga_pgroup_sync(CONCAT44(iVar4,iVar3));
      }
      local_8 = 1;
    }
  }
  return local_8;
}

Assistant:

logical pnga_destroy(Integer g_a)
{
Integer ga_handle = GA_OFFSET + g_a, grp_id, grp_me=GAme;
int local_sync_begin,local_sync_end;

    local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    grp_id = (Integer)GA[ga_handle].p_handle;
    if(local_sync_begin)pnga_pgroup_sync(grp_id);

    if (grp_id > 0) grp_me = PGRP_LIST[grp_id].map_proc_list[GAme];
    else grp_me=GAme;
    
    GAstat.numdes ++; /*regardless of array status we count this call */
    /* fails if handle is out of range or array not active */
    if(ga_handle < 0 || ga_handle >= _max_global_array){
       return FALSE;
    }
    if(GA[ga_handle].actv==0){
       return FALSE;
    }
    if (GA[ga_handle].cache)
      free(GA[ga_handle].cache);
    GA[ga_handle].cache = NULL;
    GA[ga_handle].actv = 0;     
    GA[ga_handle].actv_handle = 0;     

    if (GA[ga_handle].num_rstrctd > 0) {
      GA[ga_handle].num_rstrctd = 0;
      if (GA[ga_handle].rstrctd_list)
        free(GA[ga_handle].rstrctd_list);
      GA[ga_handle].rstrctd_list = NULL;

      if (GA[ga_handle].rank_rstrctd)
        free(GA[ga_handle].rank_rstrctd);
      GA[ga_handle].rank_rstrctd = NULL;
    }

    if(GA[ga_handle].mapc != NULL){
       free(GA[ga_handle].mapc);
       GA[ga_handle].mapc = NULL;
    } 

    if (GA[ga_handle].property == READ_CACHE) {
      if (GA[ga_handle].cache_head != NULL) {
        cache_struct_t *next;
        next = GA[ga_handle].cache_head->next;
        if (GA[ga_handle].cache_head->cache_buf)
          free(GA[ga_handle].cache_head->cache_buf);
        free(GA[ga_handle].cache_head);
        while (next) {
          GA[ga_handle].cache_head = next;
          next = next->next;
          if (GA[ga_handle].cache_head->cache_buf)
            free(GA[ga_handle].cache_head->cache_buf);
          free(GA[ga_handle].cache_head);
        }
      }
    }
    GA[ga_handle].cache_head = NULL;

    if (GA[ga_handle].property == READ_ONLY) {
      free(GA[ga_handle].old_mapc);
      pnga_pgroup_destroy(GA[ga_handle].p_handle);
    }

    if(GA[ga_handle].ptr[grp_me]==NULL){
       return TRUE;
    } 
    if (!GA[ga_handle].overlay) {
#ifndef AVOID_MA_STORAGE
      if(gai_uses_shm((int)grp_id)){
#endif
        /* make sure that we free original (before address allignment) pointer */
#ifdef MSG_COMMS_MPI
        if (grp_id > 0){
          ARMCI_Free_group(GA[ga_handle].ptr[grp_me] - GA[ga_handle].id,
              &PGRP_LIST[grp_id].group);
        }
        else
#endif
          if (GA[ga_handle].mem_dev_set) {
            ARMCI_Free_memdev(GA[ga_handle].ptr[GAme]-GA[ga_handle].id);
          } else {
            ARMCI_Free(GA[ga_handle].ptr[GAme] - GA[ga_handle].id);
          }
#ifndef AVOID_MA_STORAGE
      }else{
        if(GA[ga_handle].id != INVALID_MA_HANDLE) MA_free_heap(GA[ga_handle].id);
      }
#endif
      if(GA_memory_limited) GA_total_memory += GA[ga_handle].size;
      GAstat.curmem -= GA[ga_handle].size;
    } else {
      GA[ga_handle].overlay = 0;
    }
    GA[ga_handle].mem_dev_set = 0;     


    if(local_sync_end)pnga_pgroup_sync(grp_id);
    return(TRUE);
}